

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall duckdb_re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  bool bVar1;
  bool bVar2;
  InstOp IVar3;
  EmptyOp EVar4;
  int iVar5;
  iterator_conflict piVar6;
  Inst *pIVar7;
  int *piVar8;
  iterator_conflict piVar9;
  uint in_ECX;
  long in_RDX;
  Workq *in_RSI;
  undefined8 *in_RDI;
  bool bVar10;
  State *state;
  Inst *ip_3;
  int id_1;
  iterator i;
  int *ep_1;
  int *ip_2;
  int *markp;
  int *ep;
  int *ip_1;
  Inst *ip;
  int id;
  iterator it;
  bool sawmark;
  bool sawmatch;
  uint32_t needflags;
  int n;
  PODArray<int> inst;
  int in_stack_fffffffffffffe4c;
  Prog *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  PODArray<int> *in_stack_fffffffffffffe70;
  Prog *in_stack_fffffffffffffe78;
  Inst *in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Inst *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  iterator_conflict local_a0;
  int *local_88;
  int *local_78;
  int *local_50;
  EmptyOp local_40;
  int local_3c;
  uint local_24;
  State *local_8;
  
  Workq::size(in_RSI);
  PODArray<int>::PODArray(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  local_3c = 0;
  local_40 = 0;
  bVar10 = false;
  bVar1 = false;
  local_50 = SparseSetT<void>::begin((SparseSetT<void> *)0x821095);
  do {
    piVar6 = SparseSetT<void>::end((SparseSetT<void> *)in_stack_fffffffffffffe50);
    if ((local_50 == piVar6) ||
       ((iVar5 = *local_50, bVar10 &&
        ((*(int *)(in_RDI + 1) == 0 || (bVar2 = Workq::is_mark(in_RSI,iVar5), bVar2)))))) {
      if ((0 < local_3c) &&
         (piVar8 = PODArray<int>::operator[]
                             ((PODArray<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c),
         *piVar8 == -1)) {
        local_3c = local_3c + -1;
      }
      local_24 = in_ECX;
      if (local_40 == 0) {
        local_24 = in_ECX & 0x100;
      }
      if ((local_3c == 0) && (local_24 == 0)) {
        local_8 = (State *)0x1;
      }
      else {
        if (*(int *)(in_RDI + 1) == 1) {
          local_78 = PODArray<int>::data((PODArray<int> *)0x821524);
          piVar8 = local_78 + local_3c;
          while (local_78 < piVar8) {
            local_88 = local_78;
            while( true ) {
              bVar10 = false;
              if (local_88 < piVar8) {
                bVar10 = *local_88 != -1;
              }
              if (!bVar10) break;
              local_88 = local_88 + 1;
            }
            std::sort<int*>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            if (local_88 < piVar8) {
              local_88 = local_88 + 1;
            }
            local_78 = local_88;
          }
        }
        if (*(int *)(in_RDI + 1) == 3) {
          PODArray<int>::data((PODArray<int> *)0x821636);
          std::sort<int*>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        if (in_RDX != 0) {
          piVar8 = PODArray<int>::operator[]
                             ((PODArray<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          *piVar8 = -2;
          local_a0 = SparseSetT<void>::begin((SparseSetT<void> *)0x8216cc);
          while (piVar6 = local_a0,
                piVar9 = SparseSetT<void>::end((SparseSetT<void> *)in_stack_fffffffffffffe50),
                piVar6 != piVar9) {
            pIVar7 = Prog::inst(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            IVar3 = Prog::Inst::opcode(pIVar7);
            if (IVar3 == kInstMatch) {
              iVar5 = Prog::Inst::match_id(pIVar7);
              piVar8 = PODArray<int>::operator[]
                                 ((PODArray<int> *)in_stack_fffffffffffffe50,
                                  in_stack_fffffffffffffe4c);
              *piVar8 = iVar5;
            }
            local_a0 = local_a0 + 1;
          }
        }
        PODArray<int>::data((PODArray<int> *)0x8217f4);
        local_8 = CachedState((DFA *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                              (int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                              in_stack_fffffffffffffed8);
      }
LAB_0082184a:
      PODArray<int>::~PODArray((PODArray<int> *)0x821857);
      return local_8;
    }
    bVar2 = Workq::is_mark(in_RSI,iVar5);
    if (bVar2) {
      if ((0 < local_3c) &&
         (piVar8 = PODArray<int>::operator[]
                             ((PODArray<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c),
         *piVar8 != -1)) {
        bVar1 = true;
        local_3c = local_3c + 1;
        piVar8 = PODArray<int>::operator[]
                           ((PODArray<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        *piVar8 = -1;
      }
    }
    else {
      pIVar7 = Prog::inst(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      IVar3 = Prog::Inst::opcode(pIVar7);
      if (((((IVar3 == kInstAltMatch) && (*(int *)(in_RDI + 1) != 3)) &&
           ((*(int *)(in_RDI + 1) != 0 ||
            ((piVar6 = SparseSetT<void>::begin((SparseSetT<void> *)0x8212a8), local_50 == piVar6 &&
             (in_stack_fffffffffffffeef =
                   Prog::Inst::greedy(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78),
             (bool)in_stack_fffffffffffffeef)))))) && ((*(int *)(in_RDI + 1) != 1 || (!bVar1)))) &&
         ((in_ECX & 0x100) != 0)) {
        local_8 = (State *)0x2;
        goto LAB_0082184a;
      }
      in_stack_fffffffffffffee0 = Prog::inst(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      in_stack_fffffffffffffedc = Prog::Inst::last(in_stack_fffffffffffffee0);
      if (in_stack_fffffffffffffedc != 0) {
        iVar5 = *local_50;
        local_3c = local_3c + 1;
        piVar8 = PODArray<int>::operator[]
                           ((PODArray<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        *piVar8 = iVar5;
      }
      IVar3 = Prog::Inst::opcode(pIVar7);
      if (IVar3 == kInstEmptyWidth) {
        EVar4 = Prog::Inst::empty(pIVar7);
        local_40 = EVar4 | local_40;
      }
      IVar3 = Prog::Inst::opcode(pIVar7);
      if ((IVar3 == kInstMatch) && (bVar2 = Prog::anchor_end((Prog *)*in_RDI), !bVar2)) {
        bVar10 = true;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  PODArray<int> inst(q->size());
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark

  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst.data(), n, flag);
  return state;
}